

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-bignum.cpp
# Opt level: O1

void __thiscall
icu_63::double_conversion::Bignum::AssignDecimalString(Bignum *this,Vector<const_char> value)

{
  uint *puVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  int exponent;
  uint uVar5;
  uint64_t uVar6;
  char *pcVar7;
  int iVar8;
  
  exponent = value.length_;
  if (0 < this->used_digits_) {
    puVar1 = (this->bigits_).start_;
    lVar3 = 0;
    do {
      puVar1[lVar3] = 0;
      lVar3 = lVar3 + 1;
    } while (lVar3 < this->used_digits_);
  }
  this->used_digits_ = 0;
  this->exponent_ = 0;
  uVar5 = 0;
  if (0x12 < exponent) {
    uVar5 = 0;
    pcVar7 = value.start_;
    iVar8 = exponent;
    do {
      lVar3 = 0;
      uVar6 = 0;
      do {
        uVar6 = ((long)pcVar7[lVar3] + uVar6 * 10) - 0x30;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x13);
      uVar5 = uVar5 + 0x13;
      exponent = iVar8 + -0x13;
      MultiplyByPowerOfTen(this,0x13);
      AddUInt64(this,uVar6);
      pcVar7 = pcVar7 + 0x13;
      bVar2 = 0x25 < iVar8;
      iVar8 = exponent;
    } while (bVar2);
  }
  if (exponent < 1) {
    uVar6 = 0;
  }
  else {
    uVar4 = (ulong)uVar5;
    uVar6 = 0;
    do {
      uVar6 = ((long)value.start_[uVar4] + uVar6 * 10) - 0x30;
      uVar4 = uVar4 + 1;
    } while (uVar4 < exponent + uVar5);
  }
  MultiplyByPowerOfTen(this,exponent);
  AddUInt64(this,uVar6);
  lVar3 = (long)this->used_digits_;
  if (0 < lVar3) {
    puVar1 = (this->bigits_).start_;
    do {
      if (puVar1[lVar3 + -1] != 0) goto LAB_0027dd8c;
      this->used_digits_ = (int)lVar3 + -1;
      bVar2 = 1 < lVar3;
      lVar3 = lVar3 + -1;
    } while (bVar2);
    lVar3 = 0;
  }
LAB_0027dd8c:
  if ((int)lVar3 == 0) {
    this->exponent_ = 0;
  }
  return;
}

Assistant:

void Bignum::AssignDecimalString(Vector<const char> value) {
  // 2^64 = 18446744073709551616 > 10^19
  const int kMaxUint64DecimalDigits = 19;
  Zero();
  int length = value.length();
  unsigned int pos = 0;
  // Let's just say that each digit needs 4 bits.
  while (length >= kMaxUint64DecimalDigits) {
    uint64_t digits = ReadUInt64(value, pos, kMaxUint64DecimalDigits);
    pos += kMaxUint64DecimalDigits;
    length -= kMaxUint64DecimalDigits;
    MultiplyByPowerOfTen(kMaxUint64DecimalDigits);
    AddUInt64(digits);
  }
  uint64_t digits = ReadUInt64(value, pos, length);
  MultiplyByPowerOfTen(length);
  AddUInt64(digits);
  Clamp();
}